

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_header.cpp
# Opt level: O0

bool pstore::trailer::validate(database *db,typed_address<pstore::trailer> pos)

{
  database *pdVar1;
  bool bVar2;
  bool bVar3;
  value_type vVar4;
  element_type *peVar5;
  typed_address<pstore::trailer> tVar6;
  typed_address<pstore::trailer> rhs;
  __int_type_conflict1 _Var7;
  bool local_e6;
  string local_d8;
  address local_b8;
  address local_b0;
  address local_a8;
  typed_address<pstore::trailer> local_a0;
  typed_address<pstore::trailer> local_98;
  address local_90;
  address transaction_first_byte;
  typed_address<pstore::trailer> local_60;
  typed_address<pstore::trailer> prev_pos;
  undefined1 local_50 [8];
  shared_ptr<const_pstore::trailer> footer;
  bool local_29;
  unique_ptr<pstore::region::factory,_std::default_delete<pstore::region::factory>_> uStack_28;
  bool ok;
  typed_address<pstore::trailer> local_20;
  database *db_local;
  typed_address<pstore::trailer> pos_local;
  
  local_20.a_.a_ = (address)(address)db;
  db_local = (database *)pos.a_.a_;
  uStack_28._M_t.
  super___uniq_ptr_impl<pstore::region::factory,_std::default_delete<pstore::region::factory>_>._M_t
  .super__Tuple_impl<0UL,_pstore::region::factory_*,_std::default_delete<pstore::region::factory>_>.
  super__Head_base<0UL,_pstore::region::factory_*,_false>._M_head_impl =
       (__uniq_ptr_data<pstore::region::factory,_std::default_delete<pstore::region::factory>,_true,_true>
        )typed_address<pstore::trailer>::null();
  bVar2 = typed_address<pstore::trailer>::operator==
                    ((typed_address<pstore::trailer> *)&db_local,
                     (typed_address<pstore::trailer> *)&stack0xffffffffffffffd8);
  pdVar1 = db_local;
  if (bVar2) {
    return true;
  }
  footer.super___shared_ptr<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)typed_address<pstore::trailer>::make(0x40);
  bVar3 = operator<((typed_address<pstore::trailer>)pdVar1,
                    (typed_address<pstore::trailer>)
                    footer.super___shared_ptr<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi);
  bVar2 = true;
  if (!bVar3) {
    vVar4 = typed_address<pstore::trailer>::absolute((typed_address<pstore::trailer> *)&db_local);
    bVar2 = (vVar4 & 7) != 0;
  }
  if (bVar2) {
    local_29 = false;
    goto LAB_002cb1e9;
  }
  prev_pos.a_.a_ = (address)(address)db_local;
  database::getro<pstore::trailer,void>((database *)local_50,local_20);
  peVar5 = std::__shared_ptr_access<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_50);
  local_60.a_.a_ = (address)(peVar5->a).prev_generation.a_.a_;
  peVar5 = std::__shared_ptr_access<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_50);
  bVar2 = crc_is_valid(peVar5);
  if (bVar2) {
    peVar5 = std::
             __shared_ptr_access<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_50);
    bVar2 = signature_is_valid(peVar5);
    pdVar1 = db_local;
    if (!bVar2) goto LAB_002cb053;
    tVar6 = typed_address<pstore::trailer>::make(0x70);
    bVar2 = operator>=((typed_address<pstore::trailer>)pdVar1,tVar6);
    tVar6.a_.a_ = local_60.a_.a_;
    local_e6 = false;
    if (bVar2) {
      transaction_first_byte.a_ = (value_type)db_local;
      rhs = pstore::operator-((typed_address<pstore::trailer>)db_local,1);
      local_e6 = operator>(tVar6,rhs);
    }
    if (local_e6 == false) {
      vVar4 = typed_address<pstore::trailer>::absolute((typed_address<pstore::trailer> *)&db_local);
      peVar5 = std::
               __shared_ptr_access<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_50);
      _Var7 = std::__atomic_base::operator_cast_to_unsigned_long((__atomic_base *)&(peVar5->a).size)
      ;
      if (vVar4 < _Var7) {
        local_29 = false;
      }
      else {
        local_98 = typed_address<pstore::trailer>::null();
        bVar2 = typed_address<pstore::trailer>::operator==(&local_60,&local_98);
        if (bVar2) {
          address::address(&local_90,0x40);
        }
        else {
          local_a8 = local_60.a_.a_;
          local_a0 = pstore::operator+(local_60,1);
          local_90 = typed_address<pstore::trailer>::to_address(&local_a0);
        }
        local_b8 = typed_address<pstore::trailer>::to_address
                             ((typed_address<pstore::trailer> *)&db_local);
        peVar5 = std::
                 __shared_ptr_access<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<const_pstore::trailer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_50);
        _Var7 = std::__atomic_base::operator_cast_to_unsigned_long
                          ((__atomic_base *)&(peVar5->a).size);
        local_b0 = pstore::operator-(local_b8,_Var7);
        local_29 = pstore::operator!=(&local_b0,&local_90);
        local_29 = !local_29;
      }
    }
    else {
      local_29 = false;
    }
  }
  else {
LAB_002cb053:
    local_29 = false;
  }
  std::shared_ptr<const_pstore::trailer>::~shared_ptr((shared_ptr<const_pstore::trailer> *)local_50)
  ;
LAB_002cb1e9:
  if (local_29 != false) {
    return local_29;
  }
  database::path_abi_cxx11_(&local_d8,(database *)local_20.a_.a_);
  raise<pstore::error_code,std::__cxx11::string>(footer_corrupt,&local_d8);
}

Assistant:

bool trailer::validate (database const & db, typed_address<trailer> const pos) {
        if (pos == typed_address<trailer>::null ()) {
            return true;
        }
        bool ok = true;

        // A basic validity check of footer_pos and prev before we go and
        // access them.
        if (pos < typed_address<trailer>::make (leader_size) ||
            pos.absolute () % alignof (trailer) != 0) {
            ok = false;
        } else {
            auto const footer = db.getro<trailer> (pos);
            // Get the address of the previous generation.
            typed_address<trailer> const prev_pos = footer->a.prev_generation;

            if (!footer->crc_is_valid () || !footer->signature_is_valid ()) {
                ok = false;
            } else if (pos >= typed_address<trailer>::make (sizeof (trailer)) &&
                       prev_pos > pos - 1U) {
                // The previous trailer must lie before the current one in the file,
                // be separated by at least the size of the trailer and agree with the location
                // given by the current trailer's 'size' field.
                ok = false;
            } else if (pos.absolute () < footer->a.size) {
                ok = false;
            } else {
                address const transaction_first_byte = prev_pos == typed_address<trailer>::null ()
                                                           ? address{leader_size}
                                                           : (prev_pos + 1U).to_address ();
                if (pos.to_address () - footer->a.size != transaction_first_byte) {
                    ok = false;
                }
            }
        }

        if (!ok) {
            raise (error_code::footer_corrupt, db.path ());
        }
        return ok;
    }